

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O2

vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_> *
jbcoin::STObject::getSortedFields
          (vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>
           *__return_storage_ptr__,STObject *objToSort)

{
  pointer pSVar1;
  STBase *pSVar2;
  pointer ppSVar3;
  pointer ppSVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  __normal_iterator<const_jbcoin::STBase_*const_*,_std::vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>_>
  _Var8;
  STVar *elem;
  pointer pSVar9;
  pointer ppSVar10;
  STBase *local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>::reserve
            (__return_storage_ptr__,
             (long)(int)(((long)(objToSort->v_).
                                super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(objToSort->v_).
                               super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x60));
  pSVar1 = (objToSort->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (pSVar9 = (objToSort->v_).
                super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
                _M_impl.super__Vector_impl_data._M_start; pSVar9 != pSVar1; pSVar9 = pSVar9 + 1) {
    pSVar2 = pSVar9->p_;
    iVar6 = (*pSVar2->_vptr_STBase[4])(pSVar2);
    if ((iVar6 != 0) && (pSVar2->fName->fieldValue < 0x100)) {
      local_30 = pSVar2;
      std::vector<jbcoin::STBase_const*,std::allocator<jbcoin::STBase_const*>>::
      emplace_back<jbcoin::STBase_const*>
                ((vector<jbcoin::STBase_const*,std::allocator<jbcoin::STBase_const*>> *)
                 __return_storage_ptr__,&local_30);
    }
  }
  ppSVar3 = (__return_storage_ptr__->
            super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar4 = (__return_storage_ptr__->
            super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppSVar3 != ppSVar4) {
    uVar7 = (long)ppSVar4 - (long)ppSVar3 >> 3;
    lVar5 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<jbcoin::STBase_const**,std::vector<jbcoin::STBase_const*,std::allocator<jbcoin::STBase_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<jbcoin::STObject::getSortedFields(jbcoin::STObject_const&)::__0>>
              (ppSVar3,ppSVar4,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)ppSVar4 - (long)ppSVar3 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<jbcoin::STBase_const**,std::vector<jbcoin::STBase_const*,std::allocator<jbcoin::STBase_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<jbcoin::STObject::getSortedFields(jbcoin::STObject_const&)::__0>>
                (ppSVar3,ppSVar4);
    }
    else {
      ppSVar10 = ppSVar3 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<jbcoin::STBase_const**,std::vector<jbcoin::STBase_const*,std::allocator<jbcoin::STBase_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<jbcoin::STObject::getSortedFields(jbcoin::STObject_const&)::__0>>
                (ppSVar3,ppSVar10);
      for (; ppSVar10 != ppSVar4; ppSVar10 = ppSVar10 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<jbcoin::STBase_const**,std::vector<jbcoin::STBase_const*,std::allocator<jbcoin::STBase_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<jbcoin::STObject::getSortedFields(jbcoin::STObject_const&)::__0>>
                  (ppSVar10);
      }
    }
  }
  _Var8 = std::
          __adjacent_find<__gnu_cxx::__normal_iterator<jbcoin::STBase_const*const*,std::vector<jbcoin::STBase_const*,std::allocator<jbcoin::STBase_const*>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    ((__return_storage_ptr__->
                     super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (__return_storage_ptr__->
                     super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
  if (_Var8._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<const_jbcoin::STBase_*,_std::allocator<const_jbcoin::STBase_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    return __return_storage_ptr__;
  }
  __assert_fail("std::adjacent_find (sf.cbegin (), sf.cend ()) == sf.cend ()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STObject.cpp"
                ,0x2f4,
                "static std::vector<const STBase *> jbcoin::STObject::getSortedFields(const STObject &)"
               );
}

Assistant:

std::vector<STBase const*>
STObject::getSortedFields (STObject const& objToSort)
{
    std::vector<STBase const*> sf;
    sf.reserve (objToSort.getCount ());

    // Choose the fields that we need to sort.
    for (detail::STVar const& elem : objToSort.v_)
    {
        // Pick out the fields and sort them.
        STBase const& base = elem.get();
        if ((base.getSType () != STI_NOTPRESENT) &&
            base.getFName ().shouldInclude (true))
        {
            sf.push_back (&base);
        }
    }

    // Sort the fields by fieldCode.
    std::sort (sf.begin (), sf.end (),
        [] (STBase const* a, STBase const* b) -> bool
        {
            return a->getFName ().fieldCode < b->getFName ().fieldCode;
        });

    // There should never be duplicate fields in an STObject. Verify that
    // in debug mode.
    assert (std::adjacent_find (sf.cbegin (), sf.cend ()) == sf.cend ());

    return sf;
}